

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-sampling.cpp
# Opt level: O2

void __thiscall sampler_tester::sampler_tester(sampler_tester *this,size_t n_vocab)

{
  pointer plVar1;
  pointer plVar2;
  int iVar3;
  int iVar4;
  llama_token_data local_34;
  
  (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->probs_expected).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->probs_expected).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->probs_expected).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<llama_token_data,_std::allocator<llama_token_data>_>::reserve(&this->cur,n_vocab);
  iVar3 = 0;
  iVar4 = (int)n_vocab;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (; iVar4 != iVar3; iVar3 = iVar3 + 1) {
    local_34.logit = logf((float)iVar3);
    local_34.p = 0.0;
    local_34.id = iVar3;
    std::vector<llama_token_data,_std::allocator<llama_token_data>_>::emplace_back<llama_token_data>
              (&this->cur,&local_34);
  }
  plVar1 = (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
           _M_impl.super__Vector_impl_data._M_start;
  plVar2 = (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->cur_p).data = plVar1;
  (this->cur_p).size = ((long)plVar2 - (long)plVar1) / 0xc;
  (this->cur_p).selected = -1;
  (this->cur_p).sorted = false;
  return;
}

Assistant:

sampler_tester(size_t n_vocab) {
        cur.reserve(n_vocab);
        for (llama_token token_id = 0; token_id < (llama_token)n_vocab; token_id++) {
            const float logit = logf(token_id);
            cur.emplace_back(llama_token_data{token_id, logit, 0.0f});
        }

        cur_p = llama_token_data_array { cur.data(), cur.size(), -1, false };
    }